

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+(TPZSFMatrix<long_double> *this,longdouble value)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble in_stack_00000008;
  longdouble *end;
  longdouble *src;
  longdouble *dst;
  TPZSFMatrix<long_double> *res;
  int64_t in_stack_ffffffffffffffb8;
  TPZSFMatrix<long_double> *in_stack_ffffffffffffffc0;
  longdouble *plVar3;
  longdouble *local_38;
  
  (**(code **)(*in_RSI + 0x60))();
  TPZSFMatrix(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_38 = in_RDI->fElem;
  plVar3 = (longdouble *)in_RSI[4];
  lVar1 = in_RSI[4];
  lVar2 = (**(code **)(*in_RSI + 600))();
  for (; plVar3 < (longdouble *)(lVar1 + lVar2 * 0x10); plVar3 = plVar3 + 1) {
    *local_38 = in_stack_00000008 + *plVar3;
    local_38 = local_38 + 1;
  }
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar> 
TPZSFMatrix<TVar> ::operator+(const TVar value ) const
{
	TPZSFMatrix<TVar>  res( this->Dim() );
	
	TVar *dst = res.fElem;
	TVar *src = fElem;
	TVar *end = &fElem[ Size() ];
	while ( src < end )
		*dst++ = (*src++) + value;
	
	return( res );
}